

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

_Bool options_save_custom(player_options *opts,int page)

{
  _Bool _Var1;
  char *pcVar2;
  ang_file *f_00;
  int local_484;
  int opt;
  ang_file *f;
  char file_name [80];
  char path [1024];
  _Bool success;
  char *page_name;
  int page_local;
  player_options *opts_local;
  
  pcVar2 = option_type_name(page);
  strnfmt((char *)&f,0x50,"customized_%s_options.txt",pcVar2);
  path_build(file_name + 0x48,0x400,ANGBAND_DIR_USER,(char *)&f);
  f_00 = file_open(file_name + 0x48,MODE_WRITE,FTYPE_TEXT);
  if (f_00 == (ang_file *)0x0) {
    path[0x3ff] = '\0';
  }
  else {
    path[0x3ff] = file_putf(f_00,"# These are customized defaults for the %s options.\n",pcVar2);
    _Var1 = file_put(f_00,
                     "# All lines begin with \"option:\" followed by the internal option name.\n");
    if (!_Var1) {
      path[0x3ff] = '\0';
    }
    _Var1 = file_put(f_00,
                     "# After the name is a colon followed by yes or no for the option\'s state.\n")
    ;
    if (!_Var1) {
      path[0x3ff] = '\0';
    }
    for (local_484 = 0; local_484 < 0x2c; local_484 = local_484 + 1) {
      if (options[local_484].type == page) {
        _Var1 = file_putf(f_00,"# %s\n",options[local_484].description);
        if (!_Var1) {
          path[0x3ff] = '\0';
        }
        pcVar2 = "no";
        if ((opts->opt[local_484] & 1U) != 0) {
          pcVar2 = "yes";
        }
        _Var1 = file_putf(f_00,"option:%s:%s\n",options[local_484].name,pcVar2);
        if (!_Var1) {
          path[0x3ff] = '\0';
        }
      }
    }
    _Var1 = file_close(f_00);
    if (!_Var1) {
      path[0x3ff] = '\0';
    }
  }
  return (_Bool)path[0x3ff];
}

Assistant:

bool options_save_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	bool success = true;
	char path[1024], file_name[80];
	ang_file *f;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	f = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (f) {
		int opt;

		if (!file_putf(f, "# These are customized defaults for the %s options.\n", page_name)) {
			success = false;
		}
		if (!file_put(f, "# All lines begin with \"option:\" followed by the internal option name.\n")) {
			success = false;
		}
		if (!file_put(f, "# After the name is a colon followed by yes or no for the option's state.\n")) {
			success = false;
		}
		for (opt = 0; opt < OPT_MAX; opt++) {
			if (options[opt].type == page) {
				if (!file_putf(f, "# %s\n",
						 options[opt].description)) {
					success = false;
				}
				if (!file_putf(f, "option:%s:%s\n",
						options[opt].name,
						((*opts).opt[opt]) ? "yes" : "no")) {
					success = false;
				}
			}
		}

		if (!file_close(f)) {
			success = false;
		}
	} else {
		success = false;
	}
	return success;
}